

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O0

void xc_available_functional_numbers(int *list)

{
  int iVar1;
  void *in_RDI;
  int N;
  int ii;
  int local_c;
  
  iVar1 = xc_number_of_functionals();
  for (local_c = 0; local_c < iVar1; local_c = local_c + 1) {
    *(int *)((long)in_RDI + (long)local_c * 4) = xc_functional_keys[local_c].number;
  }
  qsort(in_RDI,(long)iVar1,4,compare_int);
  return;
}

Assistant:

void xc_available_functional_numbers(int *list)
{
  int ii, N;
  N=xc_number_of_functionals();
  for(ii=0;ii<N;ii++){
    list[ii]=xc_functional_keys[ii].number;
  }
  /* Sort list by id */
  qsort(list, N, sizeof(int), compare_int);
}